

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dedma.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  FILE *__stream;
  char *pcVar5;
  int *piVar6;
  char *pcVar7;
  int iVar8;
  uint uVar9;
  obj obj [256];
  state s;
  uint32_t auStack_f0f8 [1536];
  state local_d8f8;
  
  uVar9 = 0;
  memset(&local_d8f8,0,0xd8c8);
  if (argc < 2) {
    pcVar5 = (char *)0x0;
  }
  else {
    iVar8 = 1;
    uVar9 = 0;
    pcVar5 = (char *)0x0;
    do {
      pcVar7 = argv[iVar8];
      iVar2 = strcmp(pcVar7,"-x");
      if (iVar2 == 0) {
        local_d8f8.op.flush = flush_raw;
      }
      else {
        iVar2 = strcmp(pcVar7,"-c");
        if (iVar2 == 0) {
          local_d8f8.colors = &rnndec_colorsterm;
        }
        else {
          iVar2 = strcmp(pcVar7,"-m");
          if (iVar2 == 0) {
            iVar8 = iVar8 + 1;
            if (argc <= iVar8) goto LAB_00102cc6;
            pcVar7 = argv[iVar8];
            iVar2 = strncasecmp(pcVar7,"NV",2);
            if (iVar2 == 0) {
              pcVar7 = pcVar7 + 2;
            }
            uVar4 = strtoul(pcVar7,(char **)0x0,0x10);
            local_d8f8.chipset = (uint32_t)uVar4;
          }
          else {
            iVar2 = strcmp(pcVar7,"-o");
            if (iVar2 == 0) {
              iVar2 = iVar8 + 2;
              if ((argc <= iVar2) || (uVar9 == 0x100)) goto LAB_00102cc6;
              uVar4 = strtoul(argv[(long)iVar8 + 1],(char **)0x0,0x10);
              auStack_f0f8[(long)(int)uVar9 * 6] = (uint32_t)uVar4;
              uVar4 = strtoul(argv[iVar2],(char **)0x0,0x10);
              auStack_f0f8[(long)(int)uVar9 * 6 + 1] = (uint32_t)uVar4;
              uVar9 = uVar9 + 1;
              iVar8 = iVar2;
            }
            else {
              iVar2 = strcmp(pcVar7,"-r");
              if (iVar2 == 0) {
                iVar2 = iVar8 + 1;
                if (argc <= iVar2) goto LAB_00102cc6;
                local_d8f8.op.parse = parse_renouveau;
              }
              else {
                iVar2 = strcmp(pcVar7,"-v");
                if ((iVar2 != 0) || (iVar2 = iVar8 + 2, argc <= iVar2)) goto LAB_00102cc6;
                local_d8f8.op.parse = parse_valgrind;
                lVar3 = strtol(argv[(long)iVar8 + 1],(char **)0x0,10);
                local_d8f8.filter.map = (int)lVar3;
              }
              pcVar5 = argv[iVar2];
              iVar8 = iVar2;
            }
          }
        }
      }
      iVar8 = iVar8 + 1;
    } while (iVar8 < argc);
  }
  if (pcVar5 == (char *)0x0) {
LAB_00102cc6:
    bVar1 = false;
    fprintf(_stderr,
            "usage: %s [ -x ] [ -c ] [ -m \'chipset\' ] [ -o \'handle\' \'class\' ] [ -r \'file\' ] [ -v \'map\' \'file\' ]\n\t-x\tHexadecimal output mode.\n\t-c\tClassy output mode.\n\t-m\tForce chipset version.\n\t-o\tForce handle to class mapping (repeat for multiple mappings).\n\t-r\tParse a renouveau trace.\n\t-v\tParse a valgrind-mmt trace.\n"
            ,*argv);
  }
  else {
    if (local_d8f8.colors == (rnndeccolors *)0x0) {
      local_d8f8.colors = &rnndec_colorsnull;
    }
    if (local_d8f8.op.flush == (_func_void_state_ptr_ent_ptr *)0x0) {
      local_d8f8.op.flush = flush_dma;
    }
    local_d8f8.filter.addr1 = 0xffffffff;
    bVar1 = true;
  }
  iVar8 = 0x16;
  if (bVar1) {
    __stream = fopen(pcVar5,"r");
    if (__stream == (FILE *)0x0) {
      perror(*argv);
      piVar6 = __errno_location();
      iVar8 = *piVar6;
    }
    else {
      rnn_init();
      local_d8f8.db = rnn_newdb();
      rnn_parsefile(local_d8f8.db,"nv_objects.xml");
      rnn_prepdb(local_d8f8.db);
      local_d8f8.dom = rnn_finddomain(local_d8f8.db,"NV01_SUBCHAN");
      if (0 < (int)uVar9) {
        lVar3 = 0;
        do {
          add_object(&local_d8f8,*(uint32_t *)((long)auStack_f0f8 + lVar3),
                     *(uint32_t *)((long)auStack_f0f8 + lVar3 + 4));
          lVar3 = lVar3 + 0x18;
        } while ((ulong)uVar9 * 0x18 != lVar3);
      }
      if (local_d8f8.op.parse == parse_renouveau) {
        pcVar5 = dirname(pcVar5);
        parse_renouveau_chipset(&local_d8f8,pcVar5);
        parse_renouveau_objects(&local_d8f8,pcVar5);
        parse_renouveau_startup(&local_d8f8,pcVar5);
      }
      iVar8 = 0;
      dedma(&local_d8f8,(FILE *)__stream,false);
      fclose(__stream);
      free(local_d8f8.parse.buf);
    }
  }
  return iVar8;
}

Assistant:

int
main(int argc, char *argv[])
{
	struct state s = { };
	struct obj obj[MAX_OBJECTS];
	int nobj = 0;
	char *path = NULL;
	FILE *f;
	int i;

	/* parse the command line */
	if (!configure(&s, argc, argv, &path, obj, &nobj))
		return EINVAL;

	/* open the input */
	f = fopen(path, "r");
	if (!f) {
		perror(argv[0]);
		return errno;
	}

	/* set up an rnn context */
	rnn_init();
	s.db = rnn_newdb();
	rnn_parsefile(s.db, "nv_objects.xml");
	rnn_prepdb(s.db);
	s.dom = rnn_finddomain(s.db, "NV01_SUBCHAN");

	/* insert objects specified in the command line */
	for (i = 0; i < nobj; i++)
		add_object(&s, obj[i].handle, obj[i].class);

	if (s.op.parse == parse_renouveau) {
		path = dirname(path);
		parse_renouveau_chipset(&s, path);
		parse_renouveau_objects(&s, path);
		parse_renouveau_startup(&s, path);
	}

	/* do it */
	dedma(&s, f, false);

	/* clean up */
	fclose(f);
	free(s.parse.buf);

	return 0;
}